

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O0

int re_match(re_pattern_buffer *__buffer,char *__string,int __length,int __start,
            re_registers *__regs)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  uint extraout_EAX;
  ostream *poVar5;
  runtime_error *prVar6;
  regex *r;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  ostringstream oss_8;
  ostringstream oss_7;
  cmatch cm_1;
  ostringstream oss_6;
  ostringstream oss_5;
  cmatch cm;
  ostringstream oss_4;
  ostringstream oss_3;
  smatch sm;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  string_type *in_stack_ffffffffffffede8;
  match_results<const_char_*> *in_stack_ffffffffffffedf0;
  char *in_stack_ffffffffffffedf8;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffee00;
  regex *in_stack_ffffffffffffee08;
  int n;
  undefined7 in_stack_ffffffffffffee10;
  undefined1 in_stack_ffffffffffffee17;
  undefined8 in_stack_ffffffffffffee28;
  int flags;
  regex *in_stack_ffffffffffffee30;
  cmatch *in_stack_ffffffffffffee38;
  undefined4 in_stack_ffffffffffffee40;
  int in_stack_ffffffffffffee44;
  char *in_stack_ffffffffffffee48;
  cmatch *in_stack_ffffffffffffee50;
  regex *in_stack_ffffffffffffee58;
  smatch *in_stack_ffffffffffffee60;
  string *in_stack_ffffffffffffee68;
  string local_fc0 [32];
  ostringstream local_fa0 [407];
  undefined1 local_e09;
  string local_e08 [32];
  ostringstream local_de8 [376];
  regex local_c70 [55];
  undefined1 local_c39;
  string local_c38 [32];
  ostringstream local_c18 [407];
  undefined1 local_a81;
  string local_a80 [32];
  ostringstream local_a60 [376];
  regex local_8e8 [55];
  undefined1 local_8b1;
  string local_8b0 [32];
  ostringstream local_890 [407];
  undefined1 local_6f9;
  string local_6f8 [32];
  ostringstream local_6d8 [376];
  regex local_560 [55];
  undefined1 local_529;
  string local_528 [32];
  ostringstream local_508 [376];
  regex local_390 [15];
  undefined1 local_381;
  string local_380 [32];
  ostringstream local_360 [376];
  regex local_1e8 [15];
  undefined1 local_1d9;
  string local_1d8 [32];
  ostringstream local_1b8 [392];
  regex local_30 [12];
  undefined4 local_24;
  undefined8 local_20;
  undefined8 local_18;
  char *local_10;
  byte local_1;
  
  flags = (int)((ulong)in_stack_ffffffffffffee28 >> 0x20);
  local_18 = CONCAT44(in_register_00000014,__length);
  local_20 = CONCAT44(in_register_0000000c,__start);
  local_1 = (byte)__buffer & 1;
  local_24 = SUB84(__regs,0);
  local_10 = __string;
  booster::regex::regex(local_30,(string *)__string,0);
  bVar1 = booster::regex_match<booster::regex>
                    ((string *)CONCAT17(in_stack_ffffffffffffee17,in_stack_ffffffffffffee10),
                     in_stack_ffffffffffffee08,(int)((ulong)in_stack_ffffffffffffee00 >> 0x20));
  bVar2 = (bool)(local_1 & 1);
  booster::regex::~regex(local_30);
  if (bVar1 != bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar5 = std::operator<<((ostream *)local_1b8,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x69);
    std::operator<<(poVar5," booster::regex_match(pat,booster::regex(re))==result");
    local_1d9 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1d8);
    local_1d9 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  booster::regex::regex(local_1e8,(string *)__string,0);
  bVar1 = booster::regex_match<booster::regex>
                    ((char *)in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8,
                     (regex *)in_stack_ffffffffffffedf0,
                     (int)((ulong)in_stack_ffffffffffffede8 >> 0x20));
  bVar2 = (bool)(local_1 & 1);
  booster::regex::~regex(local_1e8);
  if (bVar1 != bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_360);
    poVar5 = std::operator<<((ostream *)local_360,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x6a);
    std::operator<<(poVar5,
                    " booster::regex_match(pat.c_str(),pat.c_str()+pat.size(),booster::regex(re))==result"
                   );
    local_381 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_380);
    local_381 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::c_str();
  booster::regex::regex(local_390,(string *)__string,0);
  bVar1 = booster::regex_match<booster::regex>
                    ((char *)CONCAT17(in_stack_ffffffffffffee17,in_stack_ffffffffffffee10),
                     in_stack_ffffffffffffee08,(int)((ulong)in_stack_ffffffffffffee00 >> 0x20));
  n = (int)((ulong)in_stack_ffffffffffffee08 >> 0x20);
  uVar4 = (uint)bVar1;
  bVar3 = local_1 & 1;
  booster::regex::~regex(local_390);
  if (uVar4 != bVar3) {
    std::__cxx11::ostringstream::ostringstream(local_508);
    poVar5 = std::operator<<((ostream *)local_508,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x6b);
    std::operator<<(poVar5," booster::regex_match(pat.c_str(),booster::regex(re))==result");
    local_529 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_528);
    local_529 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_1 & 1) != 0) {
    booster::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::match_results(in_stack_ffffffffffffee00);
    booster::regex::regex(local_560,(string *)__string,0);
    bVar1 = booster::regex_match<booster::regex>
                      (in_stack_ffffffffffffee68,in_stack_ffffffffffffee60,in_stack_ffffffffffffee58
                       ,(int)((ulong)in_stack_ffffffffffffee50 >> 0x20));
    booster::regex::~regex(local_560);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_6d8);
      poVar5 = std::operator<<((ostream *)local_6d8,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x70);
      std::operator<<(poVar5," booster::regex_match(pat,sm,booster::regex(re))");
      local_6f9 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_6f8);
      local_6f9 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffee17,in_stack_ffffffffffffee10),n);
    bVar1 = booster::operator==((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_890);
      poVar5 = std::operator<<((ostream *)local_890,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x71);
      std::operator<<(poVar5," sm[pos]==key");
      local_8b1 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_8b0);
      local_8b1 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x10a6ec);
    booster::match_results<const_char_*>::match_results(in_stack_ffffffffffffedf0);
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    booster::regex::regex(local_8e8,(string *)__string,0);
    bVar1 = booster::regex_match<booster::regex>
                      (in_stack_ffffffffffffee48,
                       (char *)CONCAT44(in_stack_ffffffffffffee44,in_stack_ffffffffffffee40),
                       in_stack_ffffffffffffee38,in_stack_ffffffffffffee30,flags);
    booster::regex::~regex(local_8e8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_a60);
      poVar5 = std::operator<<((ostream *)local_a60,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x75);
      std::operator<<(poVar5,
                      " booster::regex_match(pat.c_str(),pat.c_str()+pat.size(),cm,booster::regex(re))"
                     );
      local_a81 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_a80);
      local_a81 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::match_results<const_char_*>::operator[]
              ((match_results<const_char_*> *)
               CONCAT17(in_stack_ffffffffffffee17,in_stack_ffffffffffffee10),n);
    bVar1 = booster::operator==((sub_match<const_char_*> *)in_stack_ffffffffffffedf0,
                                in_stack_ffffffffffffede8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_c18);
      poVar5 = std::operator<<((ostream *)local_c18,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x76);
      std::operator<<(poVar5," cm[pos]==key");
      local_c39 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_c38);
      local_c39 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::match_results<const_char_*>::~match_results((match_results<const_char_*> *)0x10ab4f);
    booster::match_results<const_char_*>::match_results(in_stack_ffffffffffffedf0);
    r = (regex *)std::__cxx11::string::c_str();
    booster::regex::regex(local_c70,(string *)__string,0);
    bVar3 = booster::regex_match<booster::regex>
                      ((char *)in_stack_ffffffffffffee58,in_stack_ffffffffffffee50,r,
                       in_stack_ffffffffffffee44);
    booster::regex::~regex(local_c70);
    if ((bVar3 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_de8);
      poVar5 = std::operator<<((ostream *)local_de8,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7a);
      std::operator<<(poVar5," booster::regex_match(pat.c_str(),cm,booster::regex(re))");
      local_e09 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_e08);
      local_e09 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::match_results<const_char_*>::operator[]
              ((match_results<const_char_*> *)
               CONCAT17(in_stack_ffffffffffffee17,in_stack_ffffffffffffee10),n);
    bVar1 = booster::operator==((sub_match<const_char_*> *)in_stack_ffffffffffffedf0,
                                in_stack_ffffffffffffede8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_fa0);
      poVar5 = std::operator<<((ostream *)local_fa0,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7b);
      std::operator<<(poVar5," cm[pos]==key");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_fc0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::match_results<const_char_*>::~match_results((match_results<const_char_*> *)0x10af28);
    uVar4 = extraout_EAX;
  }
  return uVar4;
}

Assistant:

void re_match(bool result,std::string re,std::string pat,std::string key="",int pos=0)
{
	TEST(booster::regex_match(pat,booster::regex(re))==result);
	TEST(booster::regex_match(pat.c_str(),pat.c_str()+pat.size(),booster::regex(re))==result);
	TEST(booster::regex_match(pat.c_str(),booster::regex(re))==result);

	if(result) {
		{
			booster::smatch sm;
			TEST(booster::regex_match(pat,sm,booster::regex(re)));
			TEST(sm[pos]==key);
		}
		{
			booster::cmatch cm;
			TEST(booster::regex_match(pat.c_str(),pat.c_str()+pat.size(),cm,booster::regex(re)));
			TEST(cm[pos]==key);
		}
		{
			booster::cmatch cm;
			TEST(booster::regex_match(pat.c_str(),cm,booster::regex(re)));
			TEST(cm[pos]==key);
		}
	}
}